

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

State __thiscall QAccessibleTableHeaderCell::state(QAccessibleTableHeaderCell *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  QHeaderView *pQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QHeaderView *h;
  State s;
  undefined8 in_stack_ffffffffffffffd0;
  WidgetAttribute attribute;
  QAccessibleTableHeaderCell *in_stack_ffffffffffffffe0;
  State local_10;
  
  attribute = (WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (State)&DAT_aaaaaaaaaaaaaaaa;
  QAccessible::State::State((State *)0x7fa04b);
  pQVar4 = headerView(in_stack_ffffffffffffffe0);
  if (pQVar4 != (QHeaderView *)0x0) {
    bVar2 = QWidget::testAttribute(in_RDI,attribute);
    bVar3 = QWidget::isEnabled((QWidget *)0x7fa099);
    local_10._4_4_ = 0xaaaaaaaa;
    local_10._0_4_ = (uint)((bVar2 ^ 0xffU) & 1) << 0x11 | 0xaaa8aaaa | (uint)((bVar3 ^ 0xffU) & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::State QAccessibleTableHeaderCell::state() const
{
    QAccessible::State s;
    if (QHeaderView *h = headerView()) {
        s.invisible = !h->testAttribute(Qt::WA_WState_Visible);
        s.disabled = !h->isEnabled();
    }
    return s;
}